

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightHandle __thiscall
pbrt::LightHandle::Create
          (LightHandle *this,string *name,ParameterDictionary *parameters,Transform *renderFromLight
          ,CameraTransform *cameraTransform,MediumHandle *outsideMedium,FileLoc *loc,Allocator alloc
          )

{
  long lVar1;
  undefined1 auVar2 [16];
  float __x;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  bool bVar6;
  uintptr_t iptr;
  PointLight *pPVar7;
  ProjectionLight *pPVar8;
  GoniometricLight *pGVar9;
  DistantLight *pDVar10;
  UniformInfiniteLight *pUVar11;
  RGBColorSpace *pRVar12;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar13;
  ImageInfiniteLight *pIVar14;
  Transform *loc_00;
  uintptr_t iptr_1;
  ulong uVar15;
  ulong uVar16;
  DenselySampledSpectrum *pDVar17;
  pointer p;
  uint uVar18;
  CameraTransform *pCVar19;
  char *message;
  long lVar20;
  Float FVar21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [56];
  undefined1 auVar25 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Point3<float> PVar26;
  Float local_4c0;
  allocator<char> local_4b9;
  float local_4b8;
  Float local_4b4;
  Transform *local_4b0;
  Allocator alloc_local;
  allocator<char> local_49a;
  allocator<char> local_499;
  RGBColorSpace *colorSpace;
  uint local_490;
  Float local_48c;
  Float local_488;
  Float local_484;
  ParameterDictionary *local_480;
  CameraTransform *local_478;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  uint local_458;
  undefined1 local_448 [16];
  WrapMode2D local_410;
  string filename;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> L;
  ImageChannelDesc channelDesc;
  SpectrumHandle local_3a0;
  ColorEncodingHandle local_398;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_390;
  SpectrumHandle local_388;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_380;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_378;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_370;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_368;
  Image image;
  ImageAndMetadata imageAndMetadata;
  undefined1 extraout_var [60];
  
  (this->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = 0;
  alloc_local = alloc;
  loc_00 = renderFromLight;
  local_478 = cameraTransform;
  bVar6 = std::operator==(name,"point");
  if (bVar6) {
    local_368.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar7 = PointLight::Create(renderFromLight,(MediumHandle *)&local_368,parameters,
                                parameters->colorSpace,(FileLoc *)cameraTransform,alloc);
    uVar15 = (ulong)pPVar7 | 0x1000000000000;
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = uVar15;
    goto LAB_00345c5f;
  }
  local_4b0 = renderFromLight;
  bVar6 = std::operator==(name,"spot");
  if (bVar6) {
    local_370.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar8 = (ProjectionLight *)
             SpotLight::Create(local_4b0,(MediumHandle *)&local_370,parameters,
                               parameters->colorSpace,(FileLoc *)cameraTransform,alloc);
    uVar15 = 0x5000000000000;
LAB_00345c07:
    uVar15 = uVar15 | (ulong)pPVar8;
  }
  else {
    bVar6 = std::operator==(name,"goniometric");
    if (!bVar6) {
      bVar6 = std::operator==(name,"projection");
      if (bVar6) {
        local_380.bits =
             (outsideMedium->
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             ).bits;
        pPVar8 = ProjectionLight::Create(local_4b0,(MediumHandle *)&local_380,parameters,loc,alloc);
        uVar15 = 0x3000000000000;
        goto LAB_00345c07;
      }
      bVar6 = std::operator==(name,"distant");
      if (bVar6) {
        pDVar10 = DistantLight::Create
                            (local_4b0,parameters,parameters->colorSpace,(FileLoc *)loc_00,alloc);
        uVar15 = (ulong)pDVar10 | 0x2000000000000;
        goto LAB_00345c51;
      }
      bVar6 = std::operator==(name,"infinite");
      if (!bVar6) {
        ErrorExit<std::__cxx11::string_const&>(loc,"%s: light type unknown.",name);
      }
      pRVar12 = parameters->colorSpace;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&imageAndMetadata,"L",(allocator<char> *)&image);
      pCVar19 = local_478;
      ParameterDictionary::GetSpectrumArray
                (&L,parameters,(string *)&imageAndMetadata,General,alloc_local);
      std::__cxx11::string::~string((string *)&imageAndMetadata);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&imageAndMetadata,"scale",(allocator<char> *)&image);
      local_4b8 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,1.0);
      std::__cxx11::string::~string((string *)&imageAndMetadata);
      local_4c0 = local_4b8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&imageAndMetadata,"portal",(allocator<char> *)&image);
      ParameterDictionary::GetPoint3fArray(&portal,parameters,(string *)&imageAndMetadata);
      std::__cxx11::string::~string((string *)&imageAndMetadata);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&image,"filename",(allocator<char> *)&colorSpace);
      std::__cxx11::string::string<std::allocator<char>>((string *)&channelDesc,"",&local_4b9);
      ParameterDictionary::GetOneString
                ((string *)&imageAndMetadata,parameters,(string *)&image,(string *)&channelDesc);
      ResolveFilename(&filename,(string *)&imageAndMetadata);
      std::__cxx11::string::~string((string *)&imageAndMetadata);
      std::__cxx11::string::~string((string *)&channelDesc);
      std::__cxx11::string::~string((string *)&image);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&imageAndMetadata,"illuminance",(allocator<char> *)&image);
      local_4b4 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,-1.0);
      std::__cxx11::string::~string((string *)&imageAndMetadata);
      if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>._M_impl.
          super__Vector_impl_data._M_start ==
          L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (filename._M_string_length == 0) {
          pDVar17 = &pRVar12->illuminant;
          local_388.
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                   )((ulong)pDVar17 | 0x2000000000000);
          FVar21 = SpectrumToPhotometric(&local_388);
          uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_4b4),1);
          bVar6 = (bool)((byte)uVar3 & 1);
          local_4c0 = (Float)((uint)bVar6 * (int)((local_4b4 / 3.1415927) * (local_4c0 / FVar21)) +
                             (uint)!bVar6 * (int)(local_4c0 / FVar21));
          imageAndMetadata.image._0_8_ = pDVar17;
          pUVar11 = pstd::pmr::polymorphic_allocator<std::byte>::
                    new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                              (&alloc_local,local_4b0,(DenselySampledSpectrum **)&imageAndMetadata,
                               &local_4c0,&alloc_local);
          goto LAB_00345f68;
        }
        local_398.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        Image::Read(&imageAndMetadata,&filename,alloc_local,&local_398);
        colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
        local_480 = parameters;
        std::__cxx11::string::string<std::allocator<char>>((string *)&image,"R",&local_4b9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)image.channelNames.field_2.fixed,"G",&local_499);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(image.channelNames.field_2.fixed + 1),"B",&local_49a);
        requestedChannels.n = 3;
        requestedChannels.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
        Image::GetChannelDesc(&channelDesc,&imageAndMetadata.image,requestedChannels);
        parameters = local_480;
        lVar20 = 0x40;
        do {
          std::__cxx11::string::~string((string *)((long)&image.format + lVar20));
          lVar20 = lVar20 + -0x20;
        } while (lVar20 != -0x20);
        if (channelDesc.offset.nStored == 0) {
          ErrorExit<std::__cxx11::string&>
                    (loc,"%s: image provided to \"infinite\" light must have R, G, and B channels.",
                     &filename);
        }
        local_3a0.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 )((ulong)&colorSpace->illuminant | 0x2000000000000);
        FVar21 = SpectrumToPhotometric(&local_3a0);
        iVar5 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
        local_4c0 = local_4c0 / FVar21;
        auVar22 = ZEXT864(0);
        if (0.0 < local_4b4) {
          uVar18 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y / 2;
          pRVar12 = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
          local_48c = (pRVar12->XYZFromRGB).m[1][2];
          local_484 = (pRVar12->XYZFromRGB).m[1][0];
          local_488 = (pRVar12->XYZFromRGB).m[1][1];
          local_4b8 = 0.0;
          local_490 = uVar18;
          for (uVar15 = 0; uVar15 != (~((int)uVar18 >> 0x1f) & uVar18); uVar15 = uVar15 + 1) {
            __x = (((float)(int)uVar15 + 0.5) /
                   (float)imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y + -0.5
                  ) * 3.1415927;
            local_448._0_4_ = cosf(__x);
            local_448._4_4_ = extraout_XMM0_Db;
            local_448._8_4_ = extraout_XMM0_Dc;
            local_448._12_4_ = extraout_XMM0_Dd;
            auVar23._0_4_ = sinf(__x);
            auVar23._4_60_ = extraout_var;
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            uVar16 = 0;
            auVar2 = vandps_avx(auVar25,local_448);
            auVar25 = vandps_avx(auVar23._0_16_,auVar25);
            for (; uVar16 != (uint)(~(iVar5 >> 0x1f) & iVar5); uVar16 = uVar16 + 1) {
              WrapMode2D::WrapMode2D(&local_410,Clamp);
              Image::GetChannels((ImageChannelValues *)&image,&imageAndMetadata.image,
                                 (Point2i)(uVar15 << 0x20 | uVar16),local_410);
              pIVar13 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)image._8_8_;
              if (image._8_8_ == 0) {
                pIVar13 = &image.channelNames;
              }
              lVar20 = 0;
              while (lVar20 != 3) {
                FVar21 = local_484;
                if (((int)lVar20 != 0) && (FVar21 = local_488, (int)lVar20 != 1)) {
                  FVar21 = local_48c;
                }
                lVar1 = lVar20 * 4;
                lVar20 = lVar20 + 1;
                local_448._0_4_ = auVar2._0_4_;
                local_458 = auVar25._0_4_;
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)local_4b8),
                                         ZEXT416((uint)(FVar21 * *(float *)((long)&(pIVar13->alloc).
                                                                                   memoryResource +
                                                                           lVar1) *
                                                       (float)local_448._0_4_)),ZEXT416(local_458));
                local_4b8 = auVar4._0_4_;
              }
              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                        ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&image
                        );
            }
          }
          local_4c0 = (local_4b4 / ((local_4b8 / ((float)iVar5 * (float)(int)local_490)) * 9.869605)
                      ) * local_4c0;
          auVar22 = ZEXT464((uint)local_4c0);
          pCVar19 = local_478;
          parameters = local_480;
        }
        Image::SelectChannels(&image,&imageAndMetadata.image,&channelDesc,alloc_local);
        if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pIVar14 = pstd::pmr::polymorphic_allocator<std::byte>::
                    new_object<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                              (&alloc_local,local_4b0,&image,&colorSpace,&local_4c0,&filename,
                               &alloc_local);
          uVar15 = 0x8000000000000;
        }
        else {
          for (p = portal.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start; auVar24 = auVar22._8_56_,
              p != portal.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish; p = p + 1) {
            PVar26 = Transform::ApplyInverse<float>(&pCVar19->worldFromRender,p);
            auVar22._0_8_ = PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar22._8_56_ = auVar24;
            uVar3 = vmovlps_avx(auVar22._0_16_);
            (p->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar3;
            (p->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar3 >> 0x20);
            (p->super_Tuple3<pbrt::Point3,_float>).z = PVar26.super_Tuple3<pbrt::Point3,_float>.z;
          }
          pIVar14 = (ImageInfiniteLight *)
                    pstd::pmr::polymorphic_allocator<std::byte>::
                    new_object<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                              (&alloc_local,local_4b0,&image,&colorSpace,&local_4c0,&filename,
                               &portal,&alloc_local);
          uVar15 = 0x9000000000000;
        }
        uVar15 = (ulong)pIVar14 | uVar15;
        (this->
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        ).bits = uVar15;
        Image::~Image(&image);
        InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                  (&channelDesc.offset);
        ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
      }
      else {
        if (filename._M_string_length != 0) {
          message = "Can\'t specify both emission \"L\" and \"filename\" with InfiniteAreaLight";
LAB_003464b9:
          ErrorExit(loc,message);
        }
        if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          message = "Portals are not supported for InfiniteAreaLights without \"filename\".";
          goto LAB_003464b9;
        }
        local_390.bits =
             ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
               _M_impl.super__Vector_impl_data._M_start)->
             super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             ).bits;
        FVar21 = SpectrumToPhotometric((SpectrumHandle *)&local_390);
        uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_4b4),1);
        bVar6 = (bool)((byte)uVar3 & 1);
        local_4c0 = (Float)((uint)bVar6 * (int)((local_4b4 / 3.1415927) * (local_4c0 / FVar21)) +
                           (uint)!bVar6 * (int)(local_4c0 / FVar21));
        pUVar11 = pstd::pmr::polymorphic_allocator<std::byte>::
                  new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                            (&alloc_local,local_4b0,
                             L.
                             super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                             ._M_impl.super__Vector_impl_data._M_start,&local_4c0,&alloc_local);
LAB_00345f68:
        uVar15 = (ulong)pUVar11 | 0x7000000000000;
        (this->
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        ).bits = uVar15;
      }
      std::__cxx11::string::~string((string *)&filename);
      std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
                (&portal.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
      std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~_Vector_base
                (&L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)
      ;
      goto LAB_00345c5f;
    }
    local_378.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pGVar9 = GoniometricLight::Create
                       (local_4b0,(MediumHandle *)&local_378,parameters,parameters->colorSpace,loc,
                        alloc);
    uVar15 = (ulong)pGVar9 | 0x4000000000000;
  }
LAB_00345c51:
  (this->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = uVar15;
LAB_00345c5f:
  if ((uVar15 & 0xffffffffffff) == 0) {
    ErrorExit<std::__cxx11::string_const&>(loc,"%s: unable to create light.",name);
  }
  ParameterDictionary::ReportUnused(parameters);
  return (LightHandle)
         (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          )this;
}

Assistant:

LightHandle LightHandle::Create(const std::string &name,
                                const ParameterDictionary &parameters,
                                const Transform &renderFromLight,
                                const CameraTransform &cameraTransform,
                                MediumHandle outsideMedium, const FileLoc *loc,
                                Allocator alloc) {
    LightHandle light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<SpectrumHandle> L =
            parameters.GetSpectrumArray("L", SpectrumType::General, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale, alloc);
        } else if (!L.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with InfiniteAreaLight");

            if (!portal.empty())
                ErrorExit(loc, "Portals are not supported for InfiniteAreaLights "
                               "without \"filename\".");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale,
                                                           alloc);
        } else {
            ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc);
            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                int ye = image.Resolution().y / 2;
                int ys = 0;
                int xs = 0;
                int xe = image.Resolution().x;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = ys; y < ye; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    float theta = (v - 0.5f) * Pi;
                    float cosTheta = std::cos(theta);
                    float sinTheta = std::sin(theta);
                    for (int x = xs; x < xe; ++x) {
                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c) {
                            illuminance += values[c] * lum[c] * std::abs(cosTheta) *
                                           std::abs(sinTheta);
                        }
                    }
                }
                illuminance /= float(ye - ys) * float(xe - xs);
                illuminance *= Pi * Pi;

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}